

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintGroupInfo(ConsoleReporter *this)

{
  ulong uVar1;
  GroupInfo *pGVar2;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char *in_stack_00000008;
  string *in_stack_ffffffffffffffc8;
  ConsoleReporter *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  Option<Catch::GroupInfo>::operator->((Option<Catch::GroupInfo> *)(in_RDI + 0x50));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pGVar2 = Option<Catch::GroupInfo>::operator->((Option<Catch::GroupInfo> *)(in_RDI + 0x50));
    if (1 < pGVar2->groupsCounts) {
      Option<Catch::GroupInfo>::operator->((Option<Catch::GroupInfo> *)(in_RDI + 0x50));
      std::operator+(in_stack_00000008,unaff_retaddr);
      printClosedHeader(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      std::__cxx11::string::~string(local_28);
      *(undefined1 *)(in_RDI + 0x88) = 1;
    }
  }
  return;
}

Assistant:

void ConsoleReporter::lazyPrintGroupInfo() {
    if (!currentGroupInfo->name.empty() && currentGroupInfo->groupsCounts > 1) {
        printClosedHeader("Group: " + currentGroupInfo->name);
        currentGroupInfo.used = true;
    }
}